

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  test1<nrg::SyncExecutor>("SyncExecution");
  test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution (default)");
  test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution");
  test1<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution");
  test1<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution");
  testAsyncTimed();
  measure<nrg::SyncExecutor>("SyncExecution",2);
  measure<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution",2);
  measure<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution",2);
  measure<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution",2);
  poVar1 = std::operator<<((ostream *)&std::cout,"SynExecution: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," ms\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Async-InstantExecution: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," ms\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Async-TimedExecution: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," ms\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Async-PrioExecution: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," ms\n");
  test<nrg::AsyncExecutor<nrg::TimedExecution>>();
  testTimed();
  return 0;
}

Assistant:

int main()
{
    test1<nrg::SyncExecutor>("SyncExecution");
    test1<nrg::AsyncExecutor<>>("Async-InstantExecution (default)");
    test1<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution");
    test1<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution");
    test1<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution");

    testAsyncTimed();

    auto t1 = measure<nrg::SyncExecutor>("SyncExecution", 2);
    auto t2 = measure<nrg::AsyncExecutor<nrg::InstantExecution>>("Async-InstantExecution", 2);
    auto t3 = measure<nrg::AsyncExecutor<nrg::TimedExecution>>("Async-TimedExecution", 2);
    auto t4 = measure<nrg::AsyncExecutor<nrg::PrioExecution>>("Async-PrioExecution", 2);

    using namespace std::chrono;
    std::cout << "SynExecution: " << duration_cast<milliseconds>(t1).count() << " ms\n";
    std::cout << "Async-InstantExecution: " << duration_cast<milliseconds>(t2).count() << " ms\n";
    std::cout << "Async-TimedExecution: " << duration_cast<milliseconds>(t3).count() << " ms\n";
    std::cout << "Async-PrioExecution: " << duration_cast<milliseconds>(t4).count() << " ms\n";

    test<nrg::AsyncExecutor<nrg::TimedExecution>>();

    testTimed();
}